

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParseException.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SAXParseException::SAXParseException(SAXParseException *this,SAXParseException *toCopy)

{
  XMLCh *pXVar1;
  SAXParseException *toCopy_local;
  SAXParseException *this_local;
  
  SAXException::SAXException(&this->super_SAXException,&toCopy->super_SAXException);
  (this->super_SAXException)._vptr_SAXException = (_func_int **)&PTR__SAXParseException_005334d0;
  this->fColumnNumber = toCopy->fColumnNumber;
  this->fLineNumber = toCopy->fLineNumber;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  pXVar1 = XMLString::replicate(toCopy->fPublicId,(toCopy->super_SAXException).fMemoryManager);
  this->fPublicId = pXVar1;
  pXVar1 = XMLString::replicate(toCopy->fSystemId,(toCopy->super_SAXException).fMemoryManager);
  this->fSystemId = pXVar1;
  return;
}

Assistant:

SAXParseException::SAXParseException(const SAXParseException& toCopy) :

    SAXException(toCopy)
    , fColumnNumber(toCopy.fColumnNumber)
    , fLineNumber(toCopy.fLineNumber)
    , fPublicId(0)
    , fSystemId(0)
{
    fPublicId = XMLString::replicate(toCopy.fPublicId, toCopy.fMemoryManager);
    fSystemId = XMLString::replicate(toCopy.fSystemId, toCopy.fMemoryManager);
}